

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteReg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2,uint8 B3)

{
  bool bVar1;
  uchar local_2d;
  uchar uStack_2c;
  uchar uStack_2b;
  uchar uStack_2a;
  uint8 local_29;
  undefined1 auStack_28 [3];
  OpLayoutT_Reg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  uint8 B3_local;
  RegSlot R2_local;
  RegSlot R1_local;
  RegSlot R0_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_29 = B3;
  _auStack_28 = R2;
  unique0x1000009e = R1;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>(&local_2d,R0);
  if ((((bVar1) &&
       (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                          (&uStack_2c,stack0xffffffffffffffdc), bVar1)) &&
      (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                         (&uStack_2b,_auStack_28), bVar1)) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_char>
                        (&uStack_2a,local_29), bVar1)) {
    Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,&local_2d,4,this);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::TryWriteReg3B1(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2, uint8 B3)
    {
        OpLayoutT_Reg3B1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2)
            && SizePolicy::Assign(layout.B3, B3))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }